

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::ReportUnknownFieldIgnored
          (StreamReporter *this,Message *param_1,Message *param_2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *field_path)

{
  bool bVar1;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  text._M_str = "ignored: ";
  text._M_len = 9;
  io::Printer::Print<>(this->printer_,text);
  (*(this->super_Reporter)._vptr_Reporter[9])(this,field_path,1);
  bVar1 = CheckPathChanged(field_path);
  if (bVar1) {
    text_00._M_str = " -> ";
    text_00._M_len = 4;
    io::Printer::Print<>(this->printer_,text_00);
    (*(this->super_Reporter)._vptr_Reporter[9])(this,field_path,0);
  }
  text_01._M_str = "\n";
  text_01._M_len = 1;
  io::Printer::Print<>(this->printer_,text_01);
  return;
}

Assistant:

void MessageDifferencer::StreamReporter::ReportUnknownFieldIgnored(
    const Message& /*message1*/, const Message& /*message2*/,
    const std::vector<SpecificField>& field_path) {
  printer_->Print("ignored: ");
  PrintPath(field_path, true);
  if (CheckPathChanged(field_path)) {
    printer_->Print(" -> ");
    PrintPath(field_path, false);
  }
  printer_->Print("\n");  // Print for newlines.
}